

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectorOutput.cpp
# Opt level: O0

void __thiscall
Test::CollectorOutput::finishSuite
          (CollectorOutput *this,string *suiteName,uint numTests,uint numPositiveTests,
          microseconds totalDuration)

{
  runtime_error *this_00;
  uint numPositiveTests_local;
  uint numTests_local;
  string *suiteName_local;
  CollectorOutput *this_local;
  microseconds totalDuration_local;
  
  if (this->currentSuite == (SuiteInfo *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Invalid Suite!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->currentSuite->numPositiveTests = numPositiveTests;
  (this->currentSuite->suiteDuration).__r = totalDuration.__r;
  return;
}

Assistant:

void CollectorOutput::finishSuite(const std::string &suiteName, const unsigned int numTests,
    const unsigned int numPositiveTests, const std::chrono::microseconds totalDuration) {
  if (currentSuite == nullptr)
    throw std::runtime_error("Invalid Suite!");
  currentSuite->numPositiveTests = numPositiveTests;
  currentSuite->suiteDuration = totalDuration;
}